

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void baryonyx::itm::
     init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::maximize_tag>
               (bit_array *x_pessimistic,bit_array *x_optimistic,random_engine *rng,
               quadratic_cost_type<float> *c,
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *constraints,double init_random)

{
  int iVar1;
  pointer pfVar2;
  float *pfVar3;
  quad *pqVar4;
  size_type __n;
  pointer prVar5;
  pointer prVar6;
  merged_constraint *cst;
  int *piVar7;
  merged_constraint *cst_1;
  pointer pmVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *__range2;
  long lVar15;
  long lVar16;
  float fVar18;
  double dVar19;
  vector<reduced_cost,_std::allocator<reduced_cost>_> R;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  allocator_type local_71;
  ulong local_70;
  vector<reduced_cost,_std::allocator<reduced_cost>_> local_68;
  random_engine *local_50;
  quadratic_cost_type<float> *local_48;
  pointer local_40;
  double local_38;
  ulong uVar17;
  
  __n = 0;
  for (pmVar8 = (constraints->
                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pmVar8 != (constraints->
                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                )._M_impl.super__Vector_impl_data._M_finish; pmVar8 = pmVar8 + 1) {
    uVar9 = (ulong)((long)(pmVar8->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pmVar8->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar12 = uVar9 & 0xffffffff;
    if ((int)uVar9 < (int)__n) {
      uVar12 = __n;
    }
    __n = uVar12;
  }
  local_50 = rng;
  local_48 = c;
  local_38 = init_random;
  std::vector<reduced_cost,_std::allocator<reduced_cost>_>::vector(&local_68,__n,&local_71);
  pmVar8 = (constraints->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_40 = (constraints->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pmVar8 != local_40) {
    do {
      dVar19 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (local_50);
      if (dVar19 < local_38) {
        std::vector<reduced_cost,_std::allocator<reduced_cost>_>::resize
                  (&local_68,
                   (long)(pmVar8->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pmVar8->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
        pfVar2 = (pmVar8->elements).
                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_70 = (ulong)((long)(pmVar8->elements).
                                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar2) >> 3;
        if ((int)local_70 != 0) {
          pfVar3 = (local_48->linear_elements)._M_t.
                   super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl;
          pqVar4 = (local_48->quadratic_elements)._M_t.
                   super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                   .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>.
                   _M_head_impl;
          piVar7 = (local_48->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                   _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl;
          uVar12 = 0;
          do {
            iVar14 = pfVar2[uVar12].variable_index;
            fVar18 = pfVar3[iVar14];
            iVar10 = piVar7[iVar14];
            iVar1 = piVar7[(long)iVar14 + 1];
            if (iVar1 != iVar10) {
              lVar15 = 0;
              do {
                fVar18 = fVar18 + pqVar4[iVar10 + lVar15].factor;
                lVar15 = lVar15 + 1;
              } while (iVar1 - iVar10 != (int)lVar15);
            }
            local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12].value = fVar18;
            local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12].factor = pfVar2[uVar12].factor;
            local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12].id = iVar14;
            uVar12 = uVar12 + 1;
          } while (uVar12 != (local_70 & 0xffffffff));
        }
        std::
        shuffle<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  ((__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                    )local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                    )local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_finish,local_50);
        prVar6 = local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        prVar5 = local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (int)LZCOUNT(((long)local_68.
                                         super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_68.
                                         super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 2) *
                                  -0x5555555555555555) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar5,prVar6);
        }
        if ((x_pessimistic->super_bit_array_impl).m_data._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          iVar14 = -2;
          uVar13 = (uint)local_70;
          if (-1 < (int)uVar13) {
            piVar7 = &(local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                       _M_impl.super__Vector_impl_data._M_start)->factor;
            iVar10 = 0;
            uVar12 = 0xffffffffffffffff;
            do {
              if ((pmVar8->min <= iVar10) && (iVar10 <= pmVar8->max)) {
                iVar14 = (int)uVar12;
                break;
              }
              uVar12 = uVar12 + 1;
              if ((long)uVar12 < (long)(ulong)(uVar13 & 0x7fffffff)) {
                iVar10 = iVar10 + *piVar7;
              }
              piVar7 = piVar7 + 3;
            } while ((uVar13 & 0x7fffffff) != uVar12);
          }
          if (iVar14 < 0) {
            uVar12 = 0;
          }
          else {
            lVar15 = 8;
            uVar12 = 0;
            do {
              bit_array_impl::set(&x_pessimistic->super_bit_array_impl,
                                  *(int *)((long)&(local_68.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->value
                                          + lVar15));
              uVar12 = uVar12 + 1;
              lVar15 = lVar15 + 0xc;
            } while (iVar14 + 1 != uVar12);
            uVar13 = (uint)local_70;
          }
          if ((uint)uVar12 != uVar13) {
            lVar15 = (uVar12 & 0xffffffff) * 0xc + 8;
            lVar16 = (uVar12 & 0xffffffff) - (local_70 & 0xffffffff);
            do {
              bit_array_impl::unset
                        (&x_pessimistic->super_bit_array_impl,
                         *(int *)((long)&(local_68.
                                          super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->value + lVar15
                                 ));
              lVar15 = lVar15 + 0xc;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 0);
          }
        }
        uVar13 = (uint)local_70;
        if ((x_optimistic->super_bit_array_impl).m_data._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          if ((int)uVar13 < 0) {
            iVar14 = -2;
          }
          else {
            uVar9 = (ulong)(uVar13 & 0x7fffffff);
            piVar7 = &(local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                       _M_impl.super__Vector_impl_data._M_start)->factor;
            iVar10 = 0;
            uVar11 = 0xffffffffffffffff;
            uVar12 = 0xfffffffe;
            do {
              uVar17 = uVar11 & 0xffffffff;
              if (pmVar8->max < iVar10) {
                uVar17 = uVar12;
              }
              if (iVar10 < pmVar8->min) {
                uVar17 = uVar12;
              }
              iVar14 = (int)uVar17;
              if (((iVar14 != -2) && ((long)(uVar11 + 1) < (long)uVar9)) &&
                 (((reduced_cost *)(piVar7 + -1))->value < 0.0)) break;
              uVar11 = uVar11 + 1;
              if ((long)uVar11 < (long)uVar9) {
                iVar10 = iVar10 + *piVar7;
              }
              piVar7 = piVar7 + 3;
              uVar12 = uVar17;
            } while (uVar9 != uVar11);
          }
          if (iVar14 < 0) {
            uVar12 = 0;
          }
          else {
            lVar15 = 8;
            uVar12 = 0;
            do {
              bit_array_impl::set(&x_optimistic->super_bit_array_impl,
                                  *(int *)((long)&(local_68.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->value
                                          + lVar15));
              uVar12 = uVar12 + 1;
              lVar15 = lVar15 + 0xc;
            } while (iVar14 + 1 != uVar12);
            uVar13 = (uint)local_70;
          }
          if ((uint)uVar12 != uVar13) {
            lVar15 = (uVar12 & 0xffffffff) * 0xc + 8;
            lVar16 = (uVar12 & 0xffffffff) - (ulong)uVar13;
            do {
              bit_array_impl::unset
                        (&x_optimistic->super_bit_array_impl,
                         *(int *)((long)&(local_68.
                                          super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->value + lVar15
                                 ));
              lVar15 = lVar15 + 0xc;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 0);
          }
        }
      }
      pmVar8 = pmVar8 + 1;
    } while (pmVar8 != local_40);
  }
  if (local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
      super__Vector_impl_data._M_start != (reduced_cost *)0x0) {
    operator_delete(local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
init_with_pre_solve(bit_array& x_pessimistic,
                    bit_array& x_optimistic,
                    random_engine& rng,
                    const Cost& c,
                    const std::vector<merged_constraint>& constraints,
                    const double init_random) noexcept
{
    int max_length = 0;
    for (const auto& cst : constraints)
        if (length(cst.elements) > max_length)
            max_length = length(cst.elements);

    struct reduced_cost
    {
        float value;
        int factor;
        int id;
    };

    std::vector<reduced_cost> R(max_length);
    std::bernoulli_distribution dist(init_random);

    for (const auto& cst : constraints) {
        if (!dist(rng))
            continue;

        R.resize(cst.elements.size());
        const int r_size = length(cst.elements);

        for (int i = 0; i != r_size; ++i) {
            R[i].value = static_cast<float>(c[cst.elements[i].variable_index]);
            R[i].factor = cst.elements[i].factor;
            R[i].id = cst.elements[i].variable_index;
        }

        std::shuffle(std::begin(R), std::end(R), rng);
        std::sort(
          std::begin(R), std::end(R), [](const auto& lhs, const auto& rhs) {
              return is_better_solution<Mode>(lhs.value, rhs.value);
          });

        if (!x_pessimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max) {
                    best = i;
                    break;
                }

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_pessimistic.set(R[i].id);

            for (; i != r_size; ++i) {
                x_pessimistic.unset(R[i].id);
            }
        }

        if (!x_optimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max)
                    best = i;

                if (best != -2 && i + 1 < r_size &&
                    stop_iterating<Mode>(R[i + 1].value))
                    break;

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_optimistic.set(R[i].id);

            for (; i != r_size; ++i)
                x_optimistic.unset(R[i].id);
        }
    }
}